

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TextureCubeShadowCase::TextureCubeShadowCase
          (TextureCubeShadowCase *this,Context *context,char *name,char *desc,deUint32 minFilter,
          deUint32 magFilter,deUint32 wrapS,deUint32 wrapT,deUint32 format,int size,
          deUint32 compareFunc)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeShadowCase_02184c58;
  this->m_minFilter = minFilter;
  this->m_magFilter = magFilter;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_format = format;
  this->m_size = size;
  this->m_compareFunc = compareFunc;
  this->m_gradientTex = (TextureCube *)0x0;
  this->m_gridTex = (TextureCube *)0x0;
  (this->m_cases).
  super__Vector_base<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cases).
  super__Vector_base<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cases).
  super__Vector_base<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,context->m_renderCtx,context->m_testCtx->m_log,GLSL_VERSION_300_ES,
             PRECISION_HIGHP);
  this->m_caseNdx = 0;
  return;
}

Assistant:

TextureCubeShadowCase::TextureCubeShadowCase (Context& context, const char* name, const char* desc, deUint32 minFilter, deUint32 magFilter, deUint32 wrapS, deUint32 wrapT, deUint32 format, int size, deUint32 compareFunc)
	: TestCase			(context, name, desc)
	, m_minFilter		(minFilter)
	, m_magFilter		(magFilter)
	, m_wrapS			(wrapS)
	, m_wrapT			(wrapT)
	, m_format			(format)
	, m_size			(size)
	, m_compareFunc		(compareFunc)
	, m_gradientTex		(DE_NULL)
	, m_gridTex			(DE_NULL)
	, m_renderer		(context.getRenderContext(), context.getTestContext().getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
	, m_caseNdx			(0)
{
}